

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test_chi2_test<trng::geometric_dist>(geometric_dist *d)

{
  double dVar1;
  parameter_type P_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  const_iterator __position;
  const_iterator __position_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  StringRef capturedExpression;
  int iVar2;
  int iVar3;
  size_type sVar4;
  int *piVar5;
  reference pvVar6;
  reference piVar7;
  reference pvVar8;
  geometric_dist *in_RDI;
  AssertionHandler catchAssertionHandler;
  double c2_p;
  int count_old;
  double p_old;
  difference_type pos;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> min;
  int bin;
  result_type x;
  int i_1;
  lcg64_shift R;
  vector<int,_std::allocator<int>_> count;
  int N;
  int bins;
  double P;
  int i;
  vector<double,_std::allocator<double>_> p;
  undefined4 in_stack_fffffffffffffd78;
  undefined2 in_stack_fffffffffffffd7c;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  lcg64_shift *in_stack_fffffffffffffd80;
  AssertionHandler *this;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 uVar9;
  int in_stack_fffffffffffffd8c;
  undefined4 uVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  value_type in_stack_fffffffffffffd9c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffda8;
  AssertionHandler *in_stack_fffffffffffffdb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc8;
  iterator in_stack_fffffffffffffdd0;
  AssertionHandler local_1c0;
  double local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  int *local_138;
  int *local_130;
  int *local_128;
  int *local_120;
  double *local_110;
  double *local_108;
  double *local_100;
  value_type local_ec;
  AssertionHandler *local_e8;
  int *local_e0;
  size_type local_d8;
  int *local_d0;
  int *local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_74;
  undefined1 local_70 [76];
  int local_24;
  vector<double,_std::allocator<double>_> local_20;
  geometric_dist *local_8;
  
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x38ebac);
  for (local_24 = trng::geometric_dist::min(local_8); iVar3 = local_24,
      iVar2 = trng::geometric_dist::max(local_8), iVar3 <= iVar2; local_24 = local_24 + 1) {
    local_70._48_8_ =
         trng::geometric_dist::pdf
                   ((geometric_dist *)in_stack_fffffffffffffd90._M_current,in_stack_fffffffffffffd8c
                   );
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
               (value_type_conflict6 *)
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,
                                 CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))));
    local_70._40_8_ =
         trng::geometric_dist::cdf
                   ((geometric_dist *)in_stack_fffffffffffffd90._M_current,in_stack_fffffffffffffd8c
                   );
    if (0.99 < (double)local_70._40_8_) break;
  }
  iVar3 = local_24;
  iVar2 = trng::geometric_dist::max(local_8);
  if (iVar3 < iVar2) {
    dVar1 = trng::geometric_dist::cdf
                      ((geometric_dist *)in_stack_fffffffffffffd90._M_current,
                       in_stack_fffffffffffffd8c);
    local_70._32_8_ = 1.0 - dVar1;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
               (value_type_conflict6 *)
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,
                                 CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))));
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20);
  local_70._28_4_ = (undefined4)sVar4;
  local_70._24_4_ = 10000;
  local_74 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x38ed93);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffda0,CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
             ,in_stack_fffffffffffffd90._M_current,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  std::allocator<int>::~allocator((allocator<int> *)0x38edc4);
  local_a8 = trng::lcg64_shift::Default;
  uStack_a0 = DAT_005526e8;
  P_00.a._4_4_ = in_stack_fffffffffffffd8c;
  P_00.a._0_4_ = in_stack_fffffffffffffd88;
  P_00.b = (result_type)in_stack_fffffffffffffd90._M_current;
  trng::lcg64_shift::lcg64_shift
            (in_stack_fffffffffffffd80,
             CONCAT17(in_stack_fffffffffffffd7f,
                      CONCAT16(in_stack_fffffffffffffd7e,
                               CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))),P_00)
  ;
  for (local_ac = 0; local_ac < 10000; local_ac = local_ac + 1) {
    iVar3 = trng::geometric_dist::operator()
                      ((geometric_dist *)in_stack_fffffffffffffd90._M_current,
                       (lcg64_shift *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
    ;
    local_b0 = trng::geometric_dist::min(local_8);
    local_b0 = iVar3 - local_b0;
    local_b8 = local_70._28_4_ + -1;
    piVar5 = Catch::clara::std::min<int>(&local_b0,&local_b8);
    local_b4 = *piVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_70,(long)local_b4);
    *pvVar6 = *pvVar6 + 1;
  }
  while (sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20), 2 < sVar4) {
    local_c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_fffffffffffffd7f,
                                          CONCAT16(in_stack_fffffffffffffd7e,
                                                   CONCAT24(in_stack_fffffffffffffd7c,
                                                            in_stack_fffffffffffffd78))));
    local_d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_fffffffffffffd7f,
                                          CONCAT16(in_stack_fffffffffffffd7e,
                                                   CONCAT24(in_stack_fffffffffffffd7c,
                                                            in_stack_fffffffffffffd78))));
    __first._M_current._4_4_ = in_stack_fffffffffffffd9c;
    __first._M_current._0_4_ = in_stack_fffffffffffffd98;
    local_c0 = std::
               min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (__first,in_stack_fffffffffffffd90);
    piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_c0);
    if (8 < *piVar7) break;
    local_e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_fffffffffffffd7f,
                                          CONCAT16(in_stack_fffffffffffffd7e,
                                                   CONCAT24(in_stack_fffffffffffffd7c,
                                                            in_stack_fffffffffffffd78))));
    local_d8 = __gnu_cxx::operator-
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_fffffffffffffd80,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT17(in_stack_fffffffffffffd7f,
                                   CONCAT16(in_stack_fffffffffffffd7e,
                                            CONCAT24(in_stack_fffffffffffffd7c,
                                                     in_stack_fffffffffffffd78))));
    in_stack_fffffffffffffdc8 = &local_20;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffdc8,local_d8);
    local_e8 = (AssertionHandler *)*pvVar8;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_70,local_d8);
    local_ec = *pvVar6;
    local_108 = (double *)
                std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_fffffffffffffd7f,
                                    CONCAT16(in_stack_fffffffffffffd7e,
                                             CONCAT24(in_stack_fffffffffffffd7c,
                                                      in_stack_fffffffffffffd78))));
    local_100 = (double *)
                __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                           *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                          (difference_type)in_stack_fffffffffffffd80);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffd80,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,
                                 CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))));
    __position._M_current._4_4_ = in_stack_fffffffffffffd9c;
    __position._M_current._0_4_ = in_stack_fffffffffffffd98;
    in_stack_fffffffffffffdd0 =
         std::vector<double,_std::allocator<double>_>::erase
                   ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd90._M_current,
                    __position);
    in_stack_fffffffffffffdb0 = (AssertionHandler *)local_70;
    local_110 = in_stack_fffffffffffffdd0._M_current;
    local_128 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT17(in_stack_fffffffffffffd7f,
                                           CONCAT16(in_stack_fffffffffffffd7e,
                                                    CONCAT24(in_stack_fffffffffffffd7c,
                                                             in_stack_fffffffffffffd78))));
    local_120 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                                   (difference_type)in_stack_fffffffffffffd80);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffd80,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,
                                 CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))));
    __position_00._M_current._4_4_ = in_stack_fffffffffffffd9c;
    __position_00._M_current._0_4_ = in_stack_fffffffffffffd98;
    local_130 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                 (in_stack_fffffffffffffd90._M_current,__position_00);
    in_stack_fffffffffffffda0 = (vector<int,_std::allocator<int>_> *)local_70;
    local_140 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT17(in_stack_fffffffffffffd7f,
                                           CONCAT16(in_stack_fffffffffffffd7e,
                                                    CONCAT24(in_stack_fffffffffffffd7c,
                                                             in_stack_fffffffffffffd78))));
    local_148 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT17(in_stack_fffffffffffffd7f,
                                           CONCAT16(in_stack_fffffffffffffd7e,
                                                    CONCAT24(in_stack_fffffffffffffd7c,
                                                             in_stack_fffffffffffffd78))));
    __first_00._M_current._4_4_ = in_stack_fffffffffffffd9c;
    __first_00._M_current._0_4_ = in_stack_fffffffffffffd98;
    in_stack_fffffffffffffda8 =
         std::min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                   (__first_00,in_stack_fffffffffffffd90);
    local_138 = in_stack_fffffffffffffda8._M_current;
    local_c0 = in_stack_fffffffffffffda8;
    local_150 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT17(in_stack_fffffffffffffd7f,
                                           CONCAT16(in_stack_fffffffffffffd7e,
                                                    CONCAT24(in_stack_fffffffffffffd7c,
                                                             in_stack_fffffffffffffd78))));
    local_d8 = __gnu_cxx::operator-
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_fffffffffffffd80,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT17(in_stack_fffffffffffffd7f,
                                   CONCAT16(in_stack_fffffffffffffd7e,
                                            CONCAT24(in_stack_fffffffffffffd7c,
                                                     in_stack_fffffffffffffd78))));
    in_stack_fffffffffffffd90._M_current = (int *)local_e8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,local_d8);
    *pvVar8 = (double)in_stack_fffffffffffffd90._M_current + *pvVar8;
    in_stack_fffffffffffffd9c = local_ec;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_70,local_d8);
    *pvVar6 = in_stack_fffffffffffffd9c + *pvVar6;
  }
  local_158 = chi_percentil((vector<double,_std::allocator<double>_> *)
                            in_stack_fffffffffffffdd0._M_current,
                            (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc8);
  uVar9 = SUB84(local_158,0);
  uVar10 = (undefined4)((ulong)local_158 >> 0x20);
  local_1c0.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffd80,
                  CONCAT17(in_stack_fffffffffffffd7f,
                           CONCAT16(in_stack_fffffffffffffd7e,
                                    CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))))
  ;
  this = &local_1c0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x11c);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffd90._M_current,(char *)CONCAT44(uVar10,uVar9));
  capturedExpression.m_start._4_4_ = in_stack_fffffffffffffd9c;
  capturedExpression.m_start._0_4_ = in_stack_fffffffffffffd98;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffda0;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)in_stack_fffffffffffffd90._M_current,
             (StringRef *)CONCAT44(uVar10,uVar9),(SourceLineInfo *)this,capturedExpression,
             CONCAT13(in_stack_fffffffffffffd7f,
                      CONCAT12(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd7c)));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(0.01 < local_158 && local_158 < 0.99,
                      CONCAT16(in_stack_fffffffffffffd7e,
                               CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))),false
            );
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffdb0,(ExprLhs<bool> *)in_stack_fffffffffffffda8._M_current);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd90._M_current);
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}